

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt.c
# Opt level: O0

int av1_cost_coeffs_txb_estimate(MACROBLOCK *x,int plane,int block,TX_SIZE tx_size,TX_TYPE tx_type)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  SCAN_ORDER *pSVar4;
  long lVar5;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int idx;
  tran_low_t v_1;
  int pos_1;
  tran_low_t v;
  int pos;
  int c;
  int eob;
  tran_low_t *qcoeff;
  int16_t *scan;
  SCAN_ORDER *scan_order;
  macroblock_plane *p;
  int cost;
  int local_58;
  int local_40;
  int local_18;
  
  lVar3 = in_RDI + (long)in_ESI * 0x88;
  pSVar4 = get_scan('\0','\0');
  lVar5 = *(long *)(lVar3 + 0x10) + (long)(in_EDX << 4) * 4;
  uVar1 = (uint)*(ushort *)(*(long *)(lVar3 + 0x20) + (long)in_EDX * 2);
  iVar2 = *(int *)(lVar5 + (long)(int)pSVar4->scan[(int)(uVar1 - 1)] * 4);
  if (iVar2 < 1) {
    iVar2 = -iVar2;
  }
  local_18 = (iVar2 + -1) * 0x800;
  for (local_40 = uVar1 - 2; -1 < local_40; local_40 = local_40 + -1) {
    local_58 = *(int *)(lVar5 + (long)(int)pSVar4->scan[local_40] * 4);
    if (local_58 < 1) {
      local_58 = -local_58;
    }
    if (0xd < local_58) {
      local_58 = 0xe;
    }
    local_18 = costLUT[local_58] + local_18;
  }
  return (uVar1 - 1) * 0x4e3 + local_18;
}

Assistant:

static int av1_cost_coeffs_txb_estimate(const MACROBLOCK *x, const int plane,
                                        const int block, const TX_SIZE tx_size,
                                        const TX_TYPE tx_type) {
  assert(plane == 0);

  int cost = 0;
  const struct macroblock_plane *p = &x->plane[plane];
  const SCAN_ORDER *scan_order = get_scan(tx_size, tx_type);
  const int16_t *scan = scan_order->scan;
  tran_low_t *qcoeff = p->qcoeff + BLOCK_OFFSET(block);

  int eob = p->eobs[block];

  // coeffs
  int c = eob - 1;
  // eob
  {
    const int pos = scan[c];
    const tran_low_t v = abs(qcoeff[pos]) - 1;
    cost += (v << (AV1_PROB_COST_SHIFT + 2));
  }
  // other coeffs
  for (c = eob - 2; c >= 0; c--) {
    const int pos = scan[c];
    const tran_low_t v = abs(qcoeff[pos]);
    const int idx = AOMMIN(v, 14);

    cost += costLUT[idx];
  }

  // const_term does not contain DC, and log(e) does not contain eob, so both
  // (eob-1)
  cost += (const_term + loge_par) * (eob - 1);

  return cost;
}